

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUnitTest.h
# Opt level: O2

void Microsoft::VisualStudio::CppUnitTestFramework::Assert::AreEqual<Centaurus::CharClass<char>>
               (CharClass<char> *expected,CharClass<char> *actual,wchar_t *message)

{
  bool bVar1;
  wostream *pwVar2;
  CharClass<char> *val;
  CharClass<char> *val_00;
  CharClass<char> CStack_a8;
  wstring local_88;
  wstring local_68;
  CharClass<char> local_48;
  
  bVar1 = Centaurus::CharClass<char>::operator==(expected,actual);
  if (bVar1) {
    return;
  }
  pwVar2 = std::operator<<((wostream *)&std::wcerr,L"Assert failed. Expected:");
  Centaurus::CharClass<char>::CharClass(&local_48,expected);
  ToString<Centaurus::CharClass<char>>(&local_68,(Assert *)&local_48,val);
  pwVar2 = std::operator<<(pwVar2,(wstring *)&local_68);
  pwVar2 = std::operator<<(pwVar2,L" Actual:");
  Centaurus::CharClass<char>::CharClass(&CStack_a8,actual);
  ToString<Centaurus::CharClass<char>>(&local_88,(Assert *)&CStack_a8,val_00);
  pwVar2 = std::operator<<(pwVar2,(wstring *)&local_88);
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  std::__cxx11::wstring::~wstring((wstring *)&local_88);
  Centaurus::CharClass<char>::~CharClass(&CStack_a8);
  std::__cxx11::wstring::~wstring((wstring *)&local_68);
  Centaurus::CharClass<char>::~CharClass(&local_48);
  if (message != (wchar_t *)0x0) {
    pwVar2 = std::operator<<((wostream *)&std::wcerr,message);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  }
  exit(1);
}

Assistant:

static void AreEqual(const T& expected, const T& actual, const wchar_t *message = NULL)
    {
        if (!Equals(expected, actual))
        {
            std::wcerr << L"Assert failed. Expected:" << ToString(expected) << L" Actual:" << ToString(actual) << std::endl;
            if (message != NULL)
                std::wcerr << message << std::endl;
            exit(EXIT_FAILURE);
        }
    }